

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O0

bool __thiscall flatbuffers::jsons::JsonSchemaGenerator::save(JsonSchemaGenerator *this)

{
  bool bVar1;
  char *name;
  undefined1 local_30 [8];
  string file_path;
  JsonSchemaGenerator *this_local;
  
  file_path.field_2._8_8_ = this;
  GeneratedFileName((string *)local_30,this,(this->super_BaseGenerator).path_,
                    (this->super_BaseGenerator).file_name_,
                    &((this->super_BaseGenerator).parser_)->opts);
  name = (char *)std::__cxx11::string::c_str();
  bVar1 = SaveFile(name,&this->code_,false);
  std::__cxx11::string::~string((string *)local_30);
  return bVar1;
}

Assistant:

bool save() const {
    const auto file_path = GeneratedFileName(path_, file_name_, parser_.opts);
    return SaveFile(file_path.c_str(), code_, false);
  }